

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O1

void __thiscall
NaPNStatistics::halt_condition(NaPNStatistics *this,int stat_id,int sign,NaReal value)

{
  uint uVar1;
  
  if (6 < (uint)stat_id) {
    NaPrintLog("NaPNStatistics::halt_condition(): unknown id=%d\n",(ulong)(uint)stat_id);
  }
  this->mHalt = this->mHalt | 1 << ((byte)stat_id & 0x1f);
  this->HaltCond[stat_id].value = value;
  uVar1 = 0xffffffff;
  if (-1 < sign) {
    uVar1 = (uint)(sign != 0);
  }
  this->HaltCond[stat_id].sign = uVar1;
  return;
}

Assistant:

void
NaPNStatistics::halt_condition (int stat_id, int sign, NaReal value)
{
  if(stat_id < NaSI_ABSMEAN || stat_id > NaSI_ABSMAX){
    NaPrintLog("NaPNStatistics::halt_condition(): unknown id=%d\n", stat_id);
  }

  mHalt |= NaSIdToMask(stat_id);
  HaltCond[stat_id].value = value;

  if(sign < 0)
    HaltCond[stat_id].sign = LESS_THAN;
  else if(sign > 0)
    HaltCond[stat_id].sign = GREATER_THAN;
  else
    HaltCond[stat_id].sign = EQUAL_TO;
}